

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

uint ON_DimStyle::Internal_GetSystemDimstyleList
               (ON_SimpleArray<const_ON_DimStyle_*> *system_dimstyle_list)

{
  uint uVar1;
  ON_DimStyle *local_48;
  ON_DimStyle *local_40;
  ON_DimStyle *local_38;
  ON_DimStyle *local_30;
  ON_DimStyle *local_28;
  ON_DimStyle *local_20;
  ON_DimStyle *local_18;
  ON_SimpleArray<const_ON_DimStyle_*> *local_10;
  ON_SimpleArray<const_ON_DimStyle_*> *system_dimstyle_list_local;
  
  local_10 = system_dimstyle_list;
  ON_SimpleArray<const_ON_DimStyle_*>::SetCount(system_dimstyle_list,0);
  ON_SimpleArray<const_ON_DimStyle_*>::Reserve(local_10,8);
  local_18 = &Default;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(local_10,&local_18);
  local_20 = &DefaultInchDecimal;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(local_10,&local_20);
  local_28 = &DefaultInchFractional;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(local_10,&local_28);
  local_30 = &DefaultFootInchArchitecture;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(local_10,&local_30);
  local_38 = &DefaultMillimeterSmall;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(local_10,&local_38);
  local_40 = &DefaultMillimeterLarge;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(local_10,&local_40);
  local_48 = &DefaultMillimeterArchitecture;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(local_10,&local_48);
  uVar1 = ON_SimpleArray<const_ON_DimStyle_*>::UnsignedCount(local_10);
  return uVar1;
}

Assistant:

unsigned int ON_DimStyle::Internal_GetSystemDimstyleList(
  ON_SimpleArray<const ON_DimStyle*>& system_dimstyle_list
)
{
  system_dimstyle_list.SetCount(0);
  system_dimstyle_list.Reserve(8);
  system_dimstyle_list.Append(&ON_DimStyle::Default);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultInchDecimal);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultInchFractional);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultFootInchArchitecture);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultMillimeterSmall);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultMillimeterLarge);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultMillimeterArchitecture);
  return system_dimstyle_list.UnsignedCount();
}